

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase511::run(TestCase511 *this)

{
  Detail *pDVar1;
  long lVar2;
  long lVar3;
  Fault FVar4;
  void *pvVar5;
  PromiseBase PVar6;
  bool bVar7;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_197;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:536:40),_int>
  branch2;
  Fault f;
  undefined1 local_168 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:531:40),_int>
  branch1;
  ForkedPromise<int> fork;
  Promise<int> promise;
  WaitScope waitScope;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  yield();
  FVar4.exception = __kjCondition;
  pDVar1 = (Detail *)(__kjCondition->ownFile).content.size_;
  if (pDVar1 == (Detail *)0x0 || (ulong)((long)__kjCondition - (long)pDVar1) < 0x28) {
    pvVar5 = operator_new(0x400);
    PVar6.node.ptr = (OwnPromiseNode)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&_kjCondition,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:515:36)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00578c50;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    (__kjCondition->ownFile).content.size_ = 0;
    PVar6.node.ptr = (OwnPromiseNode)&__kjCondition[-1].traceCount;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&_kjCondition,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:515:36)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)&FVar4.exception[-1].traceCount = &PTR_destroy_00578c50;
    FVar4.exception[-1].details.builder.ptr = pDVar1;
  }
  f.exception = (Exception *)0x0;
  fork.hub.disposer = (Disposer *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar6.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&fork);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Promise<int>::fork((Promise<int> *)&fork);
  bVar7 = ((fork.hub.ptr)->super_ForkHubBase).refcount < 2;
  _kjCondition.value = bVar7;
  if (!bVar7) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x20c,FAILED,"!fork.hasBranches()","_kjCondition,",&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  kj::_::ForkHub<int>::addBranch((ForkHub<int> *)&f);
  bVar7 = ((fork.hub.ptr)->super_ForkHubBase).refcount < 2;
  branch1.super_PromiseBase.node.ptr._0_1_ = !bVar7;
  if (bVar7) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x20f,FAILED,"fork.hasBranches()","_kjCondition,",(DebugExpression<bool> *)&branch1)
    ;
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
  _kjCondition.value = ((fork.hub.ptr)->super_ForkHubBase).refcount < 2;
  if (_kjCondition.value) {
    kj::_::ForkHub<int>::addBranch((ForkHub<int> *)&branch2);
    lVar2 = *(long *)((long)branch2.super_PromiseBase.node.ptr + 8);
    if (lVar2 == 0 || (ulong)((long)branch2.super_PromiseBase.node.ptr - lVar2) < 0x28) {
      pvVar5 = operator_new(0x400);
      PVar6.node.ptr = (OwnPromiseNode)((long)pvVar5 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&branch2,
                 kj::_::
                 SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:531:40)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00578ca8;
      *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
    }
    else {
      *(undefined8 *)((long)branch2.super_PromiseBase.node.ptr + 8) = 0;
      PVar6.node.ptr = (OwnPromiseNode)((long)branch2.super_PromiseBase.node.ptr + -0x28);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&branch2,
                 kj::_::
                 SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:531:40)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)((long)branch2.super_PromiseBase.node.ptr + -0x28) = &PTR_destroy_00578ca8;
      *(long *)((long)branch2.super_PromiseBase.node.ptr + -0x20) = lVar2;
    }
    f.exception = (Exception *)0x0;
    __kjCondition = (Exception *)0x0;
    branch1.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar6.node.ptr;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&branch2);
    bVar7 = ((fork.hub.ptr)->super_ForkHubBase).refcount < 2;
    _kjCondition.value = !bVar7;
    if (bVar7) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x217,FAILED,"fork.hasBranches()","_kjCondition,",&_kjCondition);
      kj::_::Debug::Fault::fatal(&f);
    }
    kj::_::ForkHub<int>::addBranch((ForkHub<int> *)local_168);
    lVar3 = CONCAT44(local_168._4_4_,local_168._0_4_);
    lVar2 = *(long *)(lVar3 + 8);
    if (lVar2 == 0 || (ulong)(lVar3 - lVar2) < 0x28) {
      pvVar5 = operator_new(0x400);
      PVar6.node.ptr = (OwnPromiseNode)((long)pvVar5 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)local_168,
                 kj::_::
                 SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:536:40)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00578d00;
      *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
    }
    else {
      *(undefined8 *)(lVar3 + 8) = 0;
      PVar6.node.ptr = (OwnPromiseNode)(lVar3 + -0x28);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)local_168,
                 kj::_::
                 SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:536:40)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)(lVar3 + -0x28) = &PTR_destroy_00578d00;
      *(long *)(lVar3 + -0x20) = lVar2;
    }
    f.exception = (Exception *)0x0;
    __kjCondition = (Exception *)0x0;
    branch2.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar6.node.ptr;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_168);
    bVar7 = 1 < ((fork.hub.ptr)->super_ForkHubBase).refcount;
    _kjCondition.value = bVar7;
    if (bVar7) {
      f.exception = (Exception *)fork.hub.disposer;
      fork.hub.ptr = (ForkHub<int> *)0x0;
      Own<kj::_::ForkHub<int>,_std::nullptr_t>::dispose
                ((Own<kj::_::ForkHub<int>,_std::nullptr_t> *)&f);
      f.exception._4_4_ = Promise<int>::wait(&branch1,&waitScope);
      f.exception._0_4_ = 0x1c8;
      if ((f.exception._4_4_ != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition = 0x1c8;
        local_168._0_4_ = Promise<int>::wait(&branch1,&waitScope);
        kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                   ,0x222,ERROR,
                   "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", _kjCondition, 456, branch1.wait(waitScope)"
                   ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",
                   (DebugComparison<int,_int> *)&f,(int *)&_kjCondition,(int *)local_168);
      }
      f.exception._4_4_ = Promise<int>::wait(&branch2,&waitScope);
      f.exception._0_4_ = 0x315;
      if ((f.exception._4_4_ != 0x315) && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition = 0x315;
        local_168._0_4_ = Promise<int>::wait(&branch2,&waitScope);
        kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                   ,0x223,ERROR,
                   "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", _kjCondition, 789, branch2.wait(waitScope)"
                   ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",
                   (DebugComparison<int,_int> *)&f,(int *)&_kjCondition,(int *)local_168);
      }
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&branch2);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&branch1);
      Own<kj::_::ForkHub<int>,_std::nullptr_t>::dispose(&fork.hub);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
      WaitScope::~WaitScope(&waitScope);
      EventLoop::~EventLoop(&loop);
      return;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x21c,FAILED,"fork.hasBranches()","_kjCondition,",&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,0x211,FAILED,"!fork.hasBranches()","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Async, Fork) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater([&]() { return 123; });

  auto fork = promise.fork();

#if __GNUC__ && !__clang__ && __GNUC__ >= 7
// GCC 7 decides the open-brace below is "misleadingly indented" as if it were guarded by the `for`
// that appears in the implementation of KJ_REQUIRE(). Shut up shut up shut up.
#pragma GCC diagnostic ignored "-Wmisleading-indentation"
#endif
  KJ_ASSERT(!fork.hasBranches());
  {
    auto cancelBranch = fork.addBranch();
    KJ_ASSERT(fork.hasBranches());
  }
  KJ_ASSERT(!fork.hasBranches());

  auto branch1 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 456;
  });
  KJ_ASSERT(fork.hasBranches());
  auto branch2 = fork.addBranch().then([](int i) {
    EXPECT_EQ(123, i);
    return 789;
  });
  KJ_ASSERT(fork.hasBranches());

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}